

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrgba64_p.h
# Opt level: O0

QRgba64 rgbBlend(QRgba64 d,QRgba64 s,uint rgbAlpha)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 in_EDX;
  ulong in_RSI;
  ulong in_RDI;
  long in_FS_OFFSET;
  ulong uVar5;
  undefined1 auVar6 [16];
  __m128i vb;
  __m128i va;
  __m128i vs;
  __m128i vd;
  QRgba64 blend;
  undefined1 local_2e8 [16];
  undefined4 local_2d8;
  undefined2 uStack_2d4;
  undefined2 uStack_2d2;
  undefined4 uStack_2d0;
  undefined2 uStack_2cc;
  undefined2 uStack_2ca;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined2 local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  undefined2 local_298;
  undefined2 uStack_296;
  undefined2 uStack_294;
  undefined2 uStack_292;
  undefined2 local_288;
  undefined2 uStack_286;
  undefined2 uStack_284;
  undefined2 uStack_282;
  undefined2 local_278;
  undefined2 uStack_276;
  undefined2 uStack_274;
  undefined2 uStack_272;
  undefined1 local_1d8;
  undefined1 uStack_1d7;
  undefined1 uStack_1d6;
  undefined1 uStack_1d5;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined4 uStack_e4;
  undefined4 uStack_dc;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  
  local_1d8 = (undefined1)in_EDX;
  uStack_1d7 = (undefined1)((uint)in_EDX >> 8);
  uStack_1d6 = (undefined1)((uint)in_EDX >> 0x10);
  uStack_1d5 = (undefined1)((uint)in_EDX >> 0x18);
  local_2e8[1] = local_1d8;
  local_2e8[0] = local_1d8;
  local_2e8[2] = uStack_1d7;
  local_2e8[3] = uStack_1d7;
  local_2e8[4] = uStack_1d6;
  local_2e8[5] = uStack_1d6;
  local_2e8[6] = uStack_1d5;
  local_2e8[7] = uStack_1d5;
  local_2e8._8_8_ = 0;
  auVar6 = pshuflw(local_2e8,local_2e8,0xc6);
  local_2e8._0_8_ = auVar6._0_8_;
  local_2e8._8_8_ = auVar6._8_8_;
  uVar5 = local_2e8._0_8_ ^ 0xffffffffffffffff;
  local_278 = (short)in_RSI;
  uStack_276 = (short)(in_RSI >> 0x10);
  uStack_274 = (short)(in_RSI >> 0x20);
  uStack_272 = (short)(in_RSI >> 0x30);
  local_288 = auVar6._0_2_;
  uStack_286 = auVar6._2_2_;
  uStack_284 = auVar6._4_2_;
  uStack_282 = auVar6._6_2_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_RSI;
  auVar6 = pmulhuw(auVar4,auVar6);
  local_188 = auVar6._0_2_;
  uStack_186 = auVar6._2_2_;
  uStack_184 = auVar6._4_2_;
  uStack_182 = auVar6._6_2_;
  local_2d8 = CONCAT22(local_188,local_278 * local_288);
  _local_2d8 = CONCAT26(uStack_186,CONCAT24(uStack_276 * uStack_286,local_2d8));
  uStack_2d0 = CONCAT22(uStack_184,uStack_274 * uStack_284);
  _uStack_2d0 = CONCAT26(uStack_182,CONCAT24(uStack_272 * uStack_282,uStack_2d0));
  local_298 = (short)in_RDI;
  uStack_296 = (short)(in_RDI >> 0x10);
  uStack_294 = (short)(in_RDI >> 0x20);
  uStack_292 = (short)(in_RDI >> 0x30);
  local_2a8 = (short)uVar5;
  uStack_2a6 = (short)(uVar5 >> 0x10);
  uStack_2a4 = (short)(uVar5 >> 0x20);
  uStack_2a2 = (short)(uVar5 >> 0x30);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_RDI;
  auVar2._8_8_ = local_2e8._8_8_ ^ 0xffffffffffffffff;
  auVar2._0_8_ = uVar5;
  auVar6 = pmulhuw(auVar3,auVar2);
  local_1a8 = auVar6._0_2_;
  uStack_1a6 = auVar6._2_2_;
  uStack_1a4 = auVar6._4_2_;
  uStack_1a2 = auVar6._6_2_;
  local_2c8._0_4_ = CONCAT22(local_1a8,local_298 * local_2a8);
  local_2c8._0_6_ = CONCAT24(uStack_296 * uStack_2a6,(int)local_2c8);
  local_2c8 = CONCAT26(uStack_1a6,(undefined6)local_2c8);
  uStack_2c0._0_2_ = uStack_294 * uStack_2a4;
  uStack_2c0._2_2_ = uStack_1a4;
  uStack_2c0._4_2_ = uStack_292 * uStack_2a2;
  uStack_2c0._6_2_ = uStack_1a2;
  uStack_d4 = (int)(local_2c8 >> 0x20);
  uStack_d0 = local_2c8._8_4_;
  uStack_cc = local_2c8._12_4_;
  uStack_e4 = (int)((ulong)_local_2d8 >> 0x20);
  uStack_dc = (int)((ulong)_uStack_2d0 >> 0x20);
  auVar6 = ZEXT416(0x10);
  local_2c8 = CONCAT44((int)(uStack_d4 + uStack_e4 + ((uint)(uStack_d4 + uStack_e4) >> 0x10) +
                            0x8000) >> auVar6,
                       (int)((int)local_2c8 + local_2d8 +
                             ((uint)((int)local_2c8 + local_2d8) >> 0x10) + 0x8000) >> auVar6);
  uStack_2c0._0_4_ =
       (int)(uStack_d0 + uStack_2d0 + ((uint)(uStack_d0 + uStack_2d0) >> 0x10) + 0x8000) >> auVar6;
  uStack_2c0._4_4_ =
       (int)(uStack_cc + uStack_dc + ((uint)(uStack_cc + uStack_dc) >> 0x10) + 0x8000) >> auVar6;
  auVar1._8_8_ = uStack_2c0;
  auVar1._0_8_ = local_2c8;
  auVar6._8_8_ = uStack_2c0;
  auVar6._0_8_ = local_2c8;
  auVar6 = packssdw(auVar1,auVar6);
  local_2c8 = auVar6._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (QRgba64)local_2c8;
  }
  __stack_chk_fail();
}

Assistant:

static inline QRgba64 rgbBlend(QRgba64 d, QRgba64 s, uint rgbAlpha)
{
    QRgba64 blend;
#if defined(__SSE2__)
    __m128i vd = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(&d));
    __m128i vs = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(&s));
    __m128i va =  _mm_cvtsi32_si128(rgbAlpha);
    va = _mm_unpacklo_epi8(va, va);
    va = _mm_shufflelo_epi16(va, _MM_SHUFFLE(3, 0, 1, 2));
    __m128i vb = _mm_xor_si128(_mm_set1_epi16(-1), va);

    vs = _mm_unpacklo_epi16(_mm_mullo_epi16(vs, va), _mm_mulhi_epu16(vs, va));
    vd = _mm_unpacklo_epi16(_mm_mullo_epi16(vd, vb), _mm_mulhi_epu16(vd, vb));
    vd = _mm_add_epi32(vd, vs);
    vd = _mm_add_epi32(vd, _mm_srli_epi32(vd, 16));
    vd = _mm_add_epi32(vd, _mm_set1_epi32(0x8000));
    vd = _mm_srai_epi32(vd, 16);
    vd = _mm_packs_epi32(vd, vd);

    _mm_storel_epi64(reinterpret_cast<__m128i *>(&blend), vd);
#elif defined(__ARM_NEON__)
    uint16x4_t vd = vreinterpret_u16_u64(vmov_n_u64(d));
    uint16x4_t vs = vreinterpret_u16_u64(vmov_n_u64(s));
    uint8x8_t va8 = vreinterpret_u8_u32(vmov_n_u32(ARGB2RGBA(rgbAlpha)));
    uint16x4_t va = vreinterpret_u16_u8(vzip_u8(va8, va8).val[0]);
    uint16x4_t vb = veor_u16(vdup_n_u16(0xffff), va);

    uint32x4_t vs32 = vmull_u16(vs, va);
    uint32x4_t vd32 = vmull_u16(vd, vb);
    vd32 = vaddq_u32(vd32, vs32);
    vd32 = vsraq_n_u32(vd32, vd32, 16);
    vd = vrshrn_n_u32(vd32, 16);
    vst1_u64(reinterpret_cast<uint64_t *>(&blend), vreinterpret_u64_u16(vd));
#elif defined(__loongarch_sx)
    __m128i vd = __lsx_vldrepl_d(reinterpret_cast<const __m128i *>(&d), 0);
    __m128i vs = __lsx_vldrepl_d(reinterpret_cast<const __m128i *>(&s), 0);
    __m128i va = __lsx_vinsgr2vr_w(__lsx_vldi(0), rgbAlpha, 0);
    va = __lsx_vilvl_b(va, va);
    const __m128i shuffleMask = (__m128i)(v8i16){2, 1, 0, 3, 4, 5, 6, 7};
    va = __lsx_vshuf_h(shuffleMask, __lsx_vldi(0), va);
    __m128i vb = __lsx_vxor_v(__lsx_vreplgr2vr_h(-1), va);

    vs = __lsx_vilvl_h(__lsx_vmuh_hu(vs, va), __lsx_vmul_h(vs, va));
    vd = __lsx_vilvl_h(__lsx_vmuh_hu(vd, vb), __lsx_vmul_h(vd, vb));
    vd = __lsx_vadd_w(vd, vs);
    vd = __lsx_vadd_w(vd, __lsx_vsrli_w(vd, 16));
    vd = __lsx_vadd_w(vd, __lsx_vreplgr2vr_w(0x8000));
    vd = __lsx_vsrai_w(vd, 16);
    vd = __lsx_vpickev_h(__lsx_vsat_w(vd, 15), __lsx_vsat_w(vd, 15));
    __lsx_vstelm_d(vd, reinterpret_cast<__m128i *>(&blend), 0, 0);
#else
    const int mr = qRed(rgbAlpha);
    const int mg = qGreen(rgbAlpha);
    const int mb = qBlue(rgbAlpha);
    blend = qRgba64(qt_div_255(s.red()   * mr + d.red()   * (255 - mr)),
                    qt_div_255(s.green() * mg + d.green() * (255 - mg)),
                    qt_div_255(s.blue()  * mb + d.blue()  * (255 - mb)),
                    s.alpha());
#endif
    return blend;
}